

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

int __thiscall
glcts::LayoutBindingBaseCase::bind
          (LayoutBindingBaseCase *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  glTexParameteriFunc p_Var1;
  key_type_conflict kVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  mapped_type *ppTVar5;
  mapped_type *ppTVar6;
  mapped_type *ppTVar7;
  undefined4 extraout_var_00;
  Functions *pFVar8;
  key_type_conflict local_28 [5];
  GLint texName;
  GLint texTarget;
  int binding_local;
  LayoutBindingBaseCase *this_local;
  
  local_28[4] = 0;
  local_28[3] = 0;
  texName = __fd;
  _texTarget = this;
  iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
  iVar3 = *(int *)(CONCAT44(extraout_var,iVar3) + 0xc);
  if (iVar3 == 2) {
    local_28[4] = 0xde1;
    local_28[2] = 0;
    ppTVar5 = std::
              map<int,_glu::Texture2D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2D_*>_>_>
              ::operator[](&this->m_textures2D,local_28 + 2);
    local_28[3] = glu::Texture2D::getGLTexture(*ppTVar5);
  }
  else if (iVar3 == 3) {
    local_28[4] = 0x806f;
    local_28[0] = 0;
    ppTVar7 = std::
              map<int,_glu::Texture3D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture3D_*>_>_>
              ::operator[](&this->m_textures3D,local_28);
    local_28[3] = glu::Texture3D::getGLTexture(*ppTVar7);
  }
  else if (iVar3 == 5) {
    local_28[4] = 0x8c1a;
    local_28[1] = 0;
    ppTVar6 = std::
              map<int,_glu::Texture2DArray_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2DArray_*>_>_>
              ::operator[](&this->m_textures2DArray,local_28 + 1);
    local_28[3] = glu::Texture2DArray::getGLTexture(*ppTVar6);
  }
  iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
  iVar3 = *(int *)(CONCAT44(extraout_var_00,iVar3) + 8);
  if (iVar3 == 1) {
    pFVar8 = gl(this);
    (*pFVar8->activeTexture)(texName + 0x84c0);
    pFVar8 = gl(this);
    (*pFVar8->bindTexture)(local_28[4],local_28[3]);
    pFVar8 = gl(this);
    kVar2 = local_28[4];
    p_Var1 = pFVar8->texParameteri;
    dVar4 = glu::getGLWrapMode(CLAMP_TO_EDGE);
    (*p_Var1)(kVar2,0x2802,dVar4);
    pFVar8 = gl(this);
    kVar2 = local_28[4];
    p_Var1 = pFVar8->texParameteri;
    dVar4 = glu::getGLWrapMode(CLAMP_TO_EDGE);
    (*p_Var1)(kVar2,0x2803,dVar4);
    pFVar8 = gl(this);
    kVar2 = local_28[4];
    p_Var1 = pFVar8->texParameteri;
    dVar4 = glu::getGLFilterMode(NEAREST);
    (*p_Var1)(kVar2,0x2801,dVar4);
    pFVar8 = gl(this);
    kVar2 = local_28[4];
    p_Var1 = pFVar8->texParameteri;
    dVar4 = glu::getGLFilterMode(NEAREST);
    iVar3 = (*p_Var1)(kVar2,0x2800,dVar4);
  }
  else {
    iVar3 = iVar3 + -2;
    if (iVar3 == 0) {
      pFVar8 = gl(this);
      iVar3 = (*pFVar8->bindImageTexture)(texName,local_28[3],0,'\0',0,35000,0x8058);
    }
  }
  return iVar3;
}

Assistant:

virtual void bind(int binding)
	{
		glw::GLint texTarget = 0;
		glw::GLint texName   = 0;

		switch (getTestParameters().texture_type)
		{
		case TwoD:
			texTarget = GL_TEXTURE_2D;
			texName   = m_textures2D[0]->getGLTexture();
			break;
		case TwoDArray:
			texTarget = GL_TEXTURE_2D_ARRAY;
			texName   = m_textures2DArray[0]->getGLTexture();
			break;
		case ThreeD:
			texTarget = GL_TEXTURE_3D;
			texName   = m_textures3D[0]->getGLTexture();
			break;
		default:
			DE_ASSERT(0);
			break;
		}

		switch (getTestParameters().surface_type)
		{
		case Texture:
			gl().activeTexture(GL_TEXTURE0 + binding);
			gl().bindTexture(texTarget, texName);
			gl().texParameteri(texTarget, GL_TEXTURE_WRAP_S, glu::getGLWrapMode(tcu::Sampler::CLAMP_TO_EDGE));
			gl().texParameteri(texTarget, GL_TEXTURE_WRAP_T, glu::getGLWrapMode(tcu::Sampler::CLAMP_TO_EDGE));
			gl().texParameteri(texTarget, GL_TEXTURE_MIN_FILTER, glu::getGLFilterMode(tcu::Sampler::NEAREST));
			gl().texParameteri(texTarget, GL_TEXTURE_MAG_FILTER, glu::getGLFilterMode(tcu::Sampler::NEAREST));
			break;
		case Image:
			gl().bindImageTexture(binding, texName, 0, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA8);
			break;
		default:
			DE_ASSERT(0);
			break;
		}
	}